

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raassignment_p.h
# Opt level: O0

void __thiscall
asmjit::v1_14::RAAssignment::initLayout
          (RAAssignment *this,RARegCount *physCount,RAWorkRegs *workRegs)

{
  uint uVar1;
  byte *pbVar2;
  RARegIndex *in_RDX;
  anon_union_4_2_ebeb14a8_for_RARegCount_0 *in_RSI;
  RARegCount *in_RDI;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  undefined4 in_stack_ffffffffffffffd4;
  RegGroup group;
  
  group = (RegGroup)((uint)in_stack_ffffffffffffffd4 >> 0x18);
  if (*(long *)(in_RDI + 8) != 0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  if (*(long *)(in_RDI + 6) != 0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  RARegIndex::buildIndexes(in_RDX,in_RDI);
  in_RDI[1].field_0 = *in_RSI;
  pbVar2 = RARegCount::operator[](in_RDI,group);
  uVar1 = (uint)*pbVar2;
  pbVar2 = RARegCount::operator[](in_RDI,k0);
  in_RDI[2].field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)(uVar1 + *pbVar2);
  in_RDI[3].field_0 = *(anon_union_4_2_ebeb14a8_for_RARegCount_0 *)(in_RDX + 2);
  *(RARegIndex **)(in_RDI + 4) = in_RDX;
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void initLayout(const RARegCount& physCount, const RAWorkRegs& workRegs) noexcept {
    // Layout must be initialized before data.
    ASMJIT_ASSERT(_physToWorkMap == nullptr);
    ASMJIT_ASSERT(_workToPhysMap == nullptr);

    _layout.physIndex.buildIndexes(physCount);
    _layout.physCount = physCount;
    _layout.physTotal = uint32_t(_layout.physIndex[RegGroup::kMaxVirt]) +
                        uint32_t(_layout.physCount[RegGroup::kMaxVirt]) ;
    _layout.workCount = workRegs.size();
    _layout.workRegs = &workRegs;
  }